

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool google::protobuf::internal::MergeFromImpl<false>
               (ZeroCopyInputStream *input,MessageLite *msg,TcParseTableBase *tc_table,
               ParseFlags parse_flags)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  char *ptr;
  ParseContext ctx;
  ushort *local_b0;
  ushort *local_a8;
  ZeroCopyInputStream *local_a0;
  ParseContext local_98;
  
  local_a0 = input;
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&>
            (&local_98,io::CodedInputStream::default_recursion_limit_,false,(char **)&local_a8,
             &local_a0);
  local_b0 = local_a8;
  while( true ) {
    bVar1 = ParseContext::Done(&local_98,(char **)&local_b0);
    auVar4._8_4_ = extraout_EDX;
    auVar4._0_8_ = local_b0;
    if (bVar1) break;
    uVar2 = (uint)tc_table->fast_idx_mask & (uint)*local_b0;
    if ((uVar2 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar3 = (ulong)(uVar2 & 0xfffffff8);
    auVar4 = (**(code **)(&tc_table[1].has_bits_offset + uVar3))
                       (msg,local_b0,&local_98,
                        (ulong)*local_b0 ^ *(ulong *)(&tc_table[1].fast_idx_mask + uVar3 * 2),
                        tc_table,0);
    local_b0 = auVar4._0_8_;
    if ((local_b0 == (ushort *)0x0) || (local_98.super_EpsCopyInputStream.last_tag_minus_1_ != 0))
    break;
  }
  local_b0 = auVar4._0_8_;
  if ((tc_table->field_0x9 & 1) == 0) {
    local_a8 = local_b0;
    if (local_b0 == (ushort *)0x0) {
      TcParser::VerifyHasBitConsistency(msg,tc_table);
      auVar4._8_4_ = extraout_EDX_00;
      auVar4._0_8_ = local_b0;
      local_a8 = local_b0;
    }
  }
  else {
    auVar5 = (undefined1  [12])(*tc_table->post_loop_handler)(msg,(char *)local_b0,&local_98);
    auVar4._8_4_ = auVar5._8_4_;
    auVar4._0_8_ = local_b0;
    local_a8 = auVar5._0_8_;
  }
  local_b0 = auVar4._0_8_;
  bVar1 = false;
  if ((local_a8 != (ushort *)0x0) &&
     (bVar1 = false, local_98.super_EpsCopyInputStream.last_tag_minus_1_ == 1)) {
    bVar1 = anon_unknown_15::CheckFieldPresence
                      ((ParseContext *)msg,(MessageLite *)(ulong)parse_flags,auVar4._8_4_);
  }
  return bVar1;
}

Assistant:

bool MergeFromImpl(io::ZeroCopyInputStream* input, MessageLite* msg,
                   const internal::TcParseTableBase* tc_table,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = internal::TcParser::ParseLoop(msg, ptr, &ctx, tc_table);
  // ctx has no explicit limit (hence we end on end of stream)
  if (ABSL_PREDICT_TRUE(ptr && ctx.EndedAtEndOfStream())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}